

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_font * rf_load_image_font(rf_font *__return_storage_ptr__,rf_image image,rf_color key,
                            rf_allocator allocator)

{
  rf_source_location rVar1;
  rf_allocator_args rVar2;
  rf_glyph_info *dst;
  uint uStack_1e4;
  rf_allocator allocator_local;
  int codepoints [95];
  
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->glyphs = (rf_glyph_info *)0x0;
  __return_storage_ptr__->glyphs_count = 0;
  *(undefined8 *)&__return_storage_ptr__->valid = 0;
  (__return_storage_ptr__->texture).mipmaps = 0;
  (__return_storage_ptr__->texture).format = 0;
  *(undefined8 *)&(__return_storage_ptr__->texture).valid = 0;
  __return_storage_ptr__->base_size = 0;
  (__return_storage_ptr__->texture).id = 0;
  (__return_storage_ptr__->texture).width = 0;
  (__return_storage_ptr__->texture).height = 0;
  if (image.valid == true) {
    allocator_local.allocator_proc = allocator.allocator_proc;
    memcpy(codepoints,&DAT_001711f0,0x17c);
    rVar1.proc_name = "rf_load_image_font";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x5cc8;
    rVar2._16_8_ = (ulong)uStack_1e4 << 0x20;
    rVar2.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0xc00) << 0x40,0);
    rVar2.size_to_allocate_or_reallocate = SUB168(ZEXT816(0xc00) << 0x40,8);
    dst = (rf_glyph_info *)(*allocator.allocator_proc)(&allocator_local,rVar1,RF_AM_ALLOC,rVar2);
    rf_compute_glyph_metrics_from_image(image,key,codepoints,dst,0x60);
    rf_load_image_font_from_data(__return_storage_ptr__,image,dst,0x60);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_load_image_font(rf_image image, rf_color key, rf_allocator allocator)
{
    rf_font result = {0};

    if (image.valid)
    {
        const int codepoints[]     = RF_BUILTIN_FONT_CHARS;
        const int codepoints_count = RF_BUILTIN_CODEPOINTS_COUNT;

        rf_glyph_info* glyphs = RF_ALLOC(allocator, codepoints_count * sizeof(rf_glyph_info));

        rf_compute_glyph_metrics_from_image(image, key, codepoints, glyphs, codepoints_count);

        result = rf_load_image_font_from_data(image, glyphs, codepoints_count);
    }

    return result;
}